

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O0

lws * lws_adopt_descriptor_vhost
                (lws_vhost *vh,lws_adoption_type type,lws_sock_file_fd_type fd,char *vh_prot_name,
                lws *parent)

{
  lws *plVar1;
  undefined1 local_58 [8];
  lws_adopt_desc_t info;
  lws *parent_local;
  char *vh_prot_name_local;
  lws_adoption_type type_local;
  lws_vhost *vh_local;
  lws_sock_file_fd_type fd_local;
  
  info.opaque = parent;
  memset(local_58,0,0x28);
  info.vh_prot_name = (char *)info.opaque;
  local_58 = (undefined1  [8])vh;
  info.vh._0_4_ = type;
  info.vh._4_4_ = fd;
  info._8_8_ = vh_prot_name;
  plVar1 = lws_adopt_descriptor_vhost_via_info((lws_adopt_desc_t *)local_58);
  return plVar1;
}

Assistant:

struct lws *
lws_adopt_descriptor_vhost(struct lws_vhost *vh, lws_adoption_type type,
			   lws_sock_file_fd_type fd, const char *vh_prot_name,
			   struct lws *parent)
{
	lws_adopt_desc_t info;

	memset(&info, 0, sizeof(info));

	info.vh = vh;
	info.type = type;
	info.fd = fd;
	info.vh_prot_name = vh_prot_name;
	info.parent = parent;

	return lws_adopt_descriptor_vhost_via_info(&info);
}